

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall Container::slave(Container *this)

{
  int iVar1;
  Worker *this_00;
  SharedBarrier *this_01;
  TaskData *pTVar2;
  value_type *pvVar3;
  ContextManager *pCVar4;
  char *pcVar5;
  char *pcVar6;
  char **__argv;
  char **__envp;
  string *name;
  SharedMemoryObject<TaskData> *this_02;
  string local_e0;
  string local_c0;
  char *local_a0;
  char *path_env;
  size_t i;
  undefined1 local_88 [7];
  bool has_path;
  string local_68;
  allocator<char> local_31;
  string local_30;
  Container *local_10;
  Container *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"slave",&local_31);
  name = &local_30;
  ContextManager::set(&this->super_ContextManager,name);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  reset_sigchld();
  this_00 = Worker::get();
  this_01 = Worker::get_run_start_barrier(this_00);
  SharedBarrier::wait(this_01,name);
  pTVar2 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  pTVar2->error = false;
  CgroupController::delay_enter(this->memory_controller_);
  CgroupController::delay_enter(this->cpuacct_controller_);
  pvVar3 = std::filesystem::__cxx11::path::c_str(&this->work_dir_);
  iVar1 = chdir(pvVar3);
  if (iVar1 != 0) {
    pCVar4 = ContextManager::get();
    format_abi_cxx11_(&local_68,"chdir() failed: %m");
    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  pvVar3 = std::filesystem::__cxx11::path::c_str(&this->root_);
  iVar1 = chroot(pvVar3);
  if (iVar1 != 0) {
    pCVar4 = ContextManager::get();
    format_abi_cxx11_((string *)local_88,"chroot() failed: %m");
    (**pCVar4->_vptr_ContextManager)(pCVar4,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
  }
  open_files(this);
  dup2_fds(this);
  close_all_fds(this);
  setup_rlimits(this);
  setup_credentials(this);
  CgroupController::enter(this->memory_controller_);
  CgroupController::enter(this->cpuacct_controller_);
  i._7_1_ = 0;
  path_env = (char *)0x0;
  do {
    pcVar6 = path_env;
    pTVar2 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    pcVar5 = (char *)PlainStringVector<129UL,_5120UL>::count(&pTVar2->env);
    if (pcVar5 <= pcVar6) {
LAB_00132d10:
      if (((i._7_1_ & 1) == 0) && (local_a0 = getenv("PATH"), local_a0 != (char *)0x0)) {
        pTVar2 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
        format_abi_cxx11_(&local_c0,"PATH=%s",local_a0);
        PlainStringVector<129UL,_5120UL>::add(&pTVar2->env,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      this_02 = &this->task_data_;
      pTVar2 = SharedMemoryObject<TaskData>::operator->(this_02);
      pcVar6 = PlainStringVector<128UL,_4096UL>::operator[](&pTVar2->argv,0);
      pTVar2 = SharedMemoryObject<TaskData>::operator->(this_02);
      __argv = PlainStringVector<128UL,_4096UL>::get(&pTVar2->argv);
      pTVar2 = SharedMemoryObject<TaskData>::operator->(this_02);
      __envp = PlainStringVector<129UL,_5120UL>::get(&pTVar2->env);
      execvpe(pcVar6,__argv,__envp);
      pCVar4 = ContextManager::get();
      pTVar2 = SharedMemoryObject<TaskData>::operator->(this_02);
      pcVar6 = PlainStringVector<128UL,_4096UL>::operator[](&pTVar2->argv,0);
      format_abi_cxx11_(&local_e0,"Failed to execute command \'%s\': %m",pcVar6);
      (**pCVar4->_vptr_ContextManager)(pCVar4,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      _exit(-1);
    }
    pTVar2 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    pcVar6 = PlainStringVector<129UL,_5120UL>::operator[](&pTVar2->env,(size_t)path_env);
    iVar1 = strcmp(pcVar6,"PATH=");
    if (iVar1 == 0) {
      i._7_1_ = 1;
      goto LAB_00132d10;
    }
    path_env = path_env + 1;
  } while( true );
}

Assistant:

void Container::slave() {
    ContextManager::set(this, "slave");
    reset_sigchld();

    Worker::get().get_run_start_barrier()->wait();
    task_data_->error = false;

    memory_controller_->delay_enter();
    cpuacct_controller_->delay_enter();

    if (chdir(work_dir_.c_str()) != 0) {
        die(format("chdir() failed: %m"));
    }

    if (chroot(root_.c_str()) != 0) {
        die(format("chroot() failed: %m"));
    }

    open_files();
    dup2_fds();
    close_all_fds();
    setup_rlimits();
    setup_credentials();

    memory_controller_->enter();
    cpuacct_controller_->enter();

    bool has_path = false;
    for (size_t i = 0; i < task_data_->env.count(); ++i) {
        if (strcmp(task_data_->env[i], "PATH=") == 0) {
            has_path = true;
            break;
        }
    }
    if (!has_path) {
        char *path_env = getenv("PATH");
        if (path_env != nullptr) {
            task_data_->env.add(format("PATH=%s", path_env));
        }
    }

    execvpe(task_data_->argv[0], task_data_->argv.get(), task_data_->env.get());
    die(format("Failed to execute command '%s': %m", task_data_->argv[0]));
    _exit(-1); // we should not get here
}